

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

string * __thiscall
phosg::Image::save_abi_cxx11_(string *__return_storage_ptr__,Image *this,Format format)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  size_t __n;
  long lVar4;
  runtime_error *prVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  size_type __n_00;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  size_t size;
  uint8_t row_padding_data [4];
  uLongf idat_size;
  be_uint32_t gAMA;
  uint8_t SIG [8];
  char header [256];
  anon_struct_13_7_88857fac IHDR;
  code *local_188;
  char *local_180;
  anon_class_8_1_6971b95b local_178;
  undefined4 local_170;
  undefined4 uStack_16c;
  void *local_168;
  size_t local_160;
  undefined4 local_154;
  char local_150 [8];
  undefined1 local_148 [34];
  uint local_126;
  undefined8 local_122;
  undefined8 uStack_11a;
  undefined8 local_112;
  undefined8 uStack_10a;
  undefined8 local_102;
  undefined8 uStack_fa;
  undefined8 local_f2;
  undefined8 uStack_ea;
  undefined8 local_e2;
  undefined8 uStack_da;
  undefined8 local_d2;
  undefined8 uStack_ca;
  undefined4 local_c2;
  uint local_40;
  uint local_3c;
  undefined1 local_38;
  byte local_37;
  undefined2 local_36;
  undefined1 local_34;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_178.result = __return_storage_ptr__;
  switch(format) {
  case GRAYSCALE_PPM:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar5,"can\'t save grayscale ppm files");
    break;
  case COLOR_PPM:
    pcVar8 = "P6 %zu %zu %lu\n";
    if (this->has_alpha != false) {
      pcVar8 = "P7\nWIDTH %zu\nHEIGHT %zu\nDEPTH 4\nMAXVAL %lu\nTUPLTYPE RGB_ALPHA\nENDHDR\n";
    }
    snprintf(local_148,0x100,pcVar8,this->width,this->height,this->max_value);
    __n = strlen(local_148);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_148,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(char *)(this->data).as8,
               (ulong)(this->channel_width >> 3) * ((ulong)this->has_alpha + 3) *
               this->height * this->width);
    return __return_storage_ptr__;
  case WINDOWS_BITMAP:
    if (this->channel_width == '\b') {
      bVar2 = this->has_alpha;
      local_148._18_4_ = (undefined4)this->width;
      uVar3 = -(local_148._18_4_ * (bVar2 + 3)) & 3;
      local_170 = 0;
      local_148._22_4_ = (undefined4)this->height;
      lVar10 = 0x28;
      if (bVar2 != false) {
        lVar10 = 0x7c;
      }
      local_126 = local_148._22_4_ * local_148._18_4_ * 4;
      if (bVar2 == false) {
        local_126 = (uint)bVar2;
      }
      local_112 = 0;
      uStack_10a = 0;
      local_102 = 0;
      uStack_fa = 0;
      local_f2 = 0;
      uStack_ea = 0;
      local_e2 = 0;
      uStack_da = 0;
      local_d2 = 0;
      uStack_ca = 0;
      local_c2 = 0;
      local_148._0_2_ = 0x4d42;
      local_148._10_4_ = (undefined4)(lVar10 + 0xeU);
      local_148._2_4_ =
           local_148._22_4_ * local_148._18_4_ * (bVar2 + 3) + local_148._10_4_ +
           local_148._22_4_ * uVar3;
      local_148._6_4_ = 0;
      local_148._14_4_ = (undefined4)lVar10;
      local_148._26_2_ = 1;
      local_148._28_2_ = (ushort)bVar2 * 8 + 0x18;
      local_148._30_4_ = (uint)bVar2 + (uint)bVar2 * 2;
      local_122 = 0xb1200000b12;
      uStack_11a = 0;
      if (bVar2 == 1) {
        local_112 = 0xff00000000ff;
        uStack_10a = 0xff00000000ff0000;
        local_102 = 0x73524742;
        local_d2 = 0x800000000;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,local_148,lVar10 + 0xeU);
      if (this->has_alpha == true) {
        lVar10 = this->height;
        if (lVar10 < 1) {
          return __return_storage_ptr__;
        }
        lVar6 = lVar10 * 4;
        uVar11 = lVar10 + 1;
        do {
          lVar6 = lVar6 + -4;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)(lVar6 * this->width + (long)(this->data).raw),
                     this->width << 2);
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
        return __return_storage_ptr__;
      }
      malloc_unique((phosg *)&local_188,this->width * 3);
      pcVar8 = local_180;
      lVar10 = this->height;
      if (0 < lVar10) {
        lVar6 = lVar10 * 3;
        do {
          lVar6 = lVar6 + -3;
          lVar7 = this->width;
          if (lVar7 < 1) {
            __n_00 = lVar7 * 3;
          }
          else {
            lVar4 = 0;
            do {
              pcVar8[lVar4] = *(char *)((long)(this->data).raw + lVar4 + 2 + lVar7 * lVar6);
              pcVar8[lVar4 + 1] =
                   *(char *)((long)(this->data).raw + lVar4 + 1 + this->width * lVar6);
              pcVar8[lVar4 + 2] = *(char *)((long)(this->data).raw + lVar4 + this->width * lVar6);
              lVar4 = lVar4 + 3;
              lVar7 = this->width;
              __n_00 = lVar7 * 3;
            } while (SBORROW8(lVar4,__n_00) != lVar4 + lVar7 * -3 < 0);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,pcVar8,__n_00);
          if ((ulong)uVar3 != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,(char *)&local_170,(ulong)uVar3);
          }
          bVar2 = 1 < lVar10;
          lVar10 = lVar10 + -1;
        } while (bVar2);
      }
      if (local_180 == (char *)0x0) {
        return __return_storage_ptr__;
      }
      (*local_188)(local_180);
      return __return_storage_ptr__;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar5,"can\'t save bmp with more than 8-bit channels");
    break;
  case PNG:
    if (this->channel_width == '\b') {
      local_150[0] = -0x77;
      local_150[1] = 'P';
      local_150[2] = 'N';
      local_150[3] = 'G';
      local_150[4] = '\r';
      local_150[5] = '\n';
      local_150[6] = '\x1a';
      local_150[7] = '\n';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,local_150,8);
      uVar3 = (uint)this->width;
      local_40 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar3 = (uint)this->height;
      local_3c = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      local_38 = 8;
      local_37 = this->has_alpha << 2 | 2;
      local_36 = 0;
      local_34 = 0;
      write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                ((char (*) [5])"IHDR",&local_40,(be_uint32_t)0xd000000,&local_178);
      local_154 = 0x8fb10000;
      write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                ((char (*) [5])"gAMA",&local_154,(be_uint32_t)0x4000000,&local_178);
      lVar10 = (ulong)this->has_alpha + 3;
      size = (this->width * lVar10 + 1) * this->height;
      malloc_unique((phosg *)&local_188,size);
      if (this->height != 0) {
        uVar11 = 0;
        uVar9 = 1;
        do {
          lVar6 = this->width * lVar10;
          pvVar1 = (this->data).raw;
          local_180[(lVar6 + 1) * uVar11] = '\0';
          memcpy(local_180 + (lVar6 + 1) * uVar11 + 1,(void *)(lVar6 * uVar11 + (long)pvVar1),
                 this->width * lVar10);
          bVar2 = uVar9 < (ulong)this->height;
          uVar11 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar2);
      }
      local_160 = compressBound(size);
      malloc_unique((phosg *)&local_170,local_160);
      uVar3 = compress2(local_168,&local_160,local_180,size,9);
      if (uVar3 == 0) {
        write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                  ((char (*) [5])"IDAT",local_168,
                   (be_uint32_t)
                   ((uint)local_160 >> 0x18 | ((uint)local_160 & 0xff0000) >> 8 |
                    ((uint)local_160 & 0xff00) << 8 | (uint)local_160 << 0x18),&local_178);
        write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                  ((char (*) [5])"IEND",(void *)0x0,(be_uint32_t)0x0,&local_178);
        if (local_168 != (void *)0x0) {
          (*(code *)CONCAT44(uStack_16c,local_170))();
        }
        if (local_180 == (char *)0x0) {
          return __return_storage_ptr__;
        }
        (*local_188)();
        return __return_storage_ptr__;
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      string_printf_abi_cxx11_
                ((string *)local_148,"zlib error compressing png data: %d",(ulong)uVar3);
      ::std::runtime_error::runtime_error(prVar5,(string *)local_148);
      __cxa_throw(prVar5,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar5,"can\'t save png with more than 8-bit channels");
    break;
  default:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar5,"unknown file format in Image::save()");
  }
  __cxa_throw(prVar5,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string Image::save(Format format) const {
  string result;
  this->save_helper(format, [&result](const void* data, size_t size) {
    result.append(reinterpret_cast<const char*>(data), size);
  });
  return result;
}